

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Promise<void> __thiscall
capnproto_test::capnp::test::TestInterface::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  short sVar1;
  CallContext<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  CVar2;
  CallContext<capnproto_test::capnp::test::TestInterface::BarParams,_capnproto_test::capnp::test::TestInterface::BarResults>
  CVar3;
  CallContext<capnproto_test::capnp::test::TestInterface::BazParams,_capnproto_test::capnp::test::TestInterface::BazResults>
  CVar4;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  undefined6 in_register_00000032;
  long *plVar6;
  Promise<void> PVar7;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  PromiseNode *pPVar5;
  
  plVar6 = (long *)CONCAT62(in_register_00000032,methodId);
  sVar1 = (short)context.hook;
  if (sVar1 == 0) {
    CVar2 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::FooParams,capnproto_test::capnp::test::TestInterface::FooResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 8))(this,plVar6,CVar2.hook);
    pPVar5 = extraout_RDX;
  }
  else if (sVar1 == 1) {
    CVar3 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::BarParams,capnproto_test::capnp::test::TestInterface::BarResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x10))(this,plVar6,CVar3.hook);
    pPVar5 = extraout_RDX_00;
  }
  else if (sVar1 == 2) {
    CVar4 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestInterface::BazParams,capnproto_test::capnp::test::TestInterface::BazResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x18))(this,plVar6,CVar4.hook);
    pPVar5 = extraout_RDX_01;
  }
  else {
    PVar7 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,(char *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),0x507a58,
                       0x92b2);
    pPVar5 = PVar7.super_PromiseBase.node.ptr;
  }
  PVar7.super_PromiseBase.node.ptr = pPVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestInterface::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return foo(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestInterface::FooParams,  ::capnproto_test::capnp::test::TestInterface::FooResults>(context));
    case 1:
      return bar(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestInterface::BarParams,  ::capnproto_test::capnp::test::TestInterface::BarResults>(context));
    case 2:
      return baz(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestInterface::BazParams,  ::capnproto_test::capnp::test::TestInterface::BazResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestInterface",
          0x88eb12a0e0af92b2ull, methodId);
  }
}